

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppGeneratorTest_StringTypeForCord_Test::
~CppGeneratorTest_StringTypeForCord_Test(CppGeneratorTest_StringTypeForCord_Test *this)

{
  CppGeneratorTest_StringTypeForCord_Test *this_local;
  
  ~CppGeneratorTest_StringTypeForCord_Test(this);
  operator_delete(this,0x2d0);
  return;
}

Assistant:

TEST_F(CppGeneratorTest, StringTypeForCord) {
  CreateTempFile("foo.proto", R"schema(
    edition = "2024";
    import "google/protobuf/cpp_features.proto";

    message Foo {
      int32 bar = 1;
      bytes baz = 2 [features.(pb.cpp).string_type = CORD];
    }
  )schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --cpp_out=$tmpdir "
      "--experimental_editions foo.proto");

  ExpectNoErrors();
}